

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

uint qvariant_cast<unsigned_int>(QVariant *v)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  QMetaType *pQVar4;
  void *pvVar5;
  uint *in_RDI;
  long in_FS_OFFSET;
  uint t;
  QMetaType targetType;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Private *in_stack_ffffffffffffffc0;
  uint local_2c;
  uint local_1c;
  QMetaTypeInterface *local_18;
  QMetaTypeInterface *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = (QMetaTypeInterface *)QMetaType::fromType<unsigned_int>();
  local_18 = (QMetaTypeInterface *)QVariant::Private::type(in_stack_ffffffffffffffc0);
  bVar1 = operator==((QMetaType *)in_stack_ffffffffffffffc0,
                     (QMetaType *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (bVar1) {
    if ((*(ulong *)(in_RDI + 6) & 1) == 0) {
      local_2c = *in_RDI;
    }
    else {
      iVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x4f9055);
      if (iVar2 == 1) {
        puVar3 = (uint *)QVariant::PrivateShared::data(*(PrivateShared **)in_RDI);
        local_2c = *puVar3;
      }
      else {
        puVar3 = QVariant::Private::get<unsigned_int>((Private *)0x4f9079);
        local_2c = *puVar3;
      }
    }
  }
  else {
    local_1c = 0;
    pQVar4 = (QMetaType *)QVariant::metaType();
    pvVar5 = QVariant::constData((QVariant *)0x4f90a2);
    QMetaType::convert(pQVar4,pvVar5,(QMetaType *)local_10,&local_1c);
    local_2c = local_1c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(QVariant &&v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType) {
        if (!v.d.is_shared) {
            return std::move(*reinterpret_cast<T *>(v.d.data.data));
        } else {
            if (v.d.data.shared->ref.loadRelaxed() == 1)
                return std::move(*reinterpret_cast<T *>(v.d.data.shared->data()));
            else
                return v.d.get<T>();
        }
    }
    if constexpr (std::is_same_v<T, QVariant>) {
        // if the metatype doesn't match, but we want a QVariant, just return the current variant
        return v;
    } if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        // moving a pointer is pointless, just do the same as the const & overload
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}